

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

StructNew * __thiscall
wasm::Builder::makeStructNew(Builder *this,HeapType type,initializer_list<wasm::Expression_*> args)

{
  Type local_38;
  StructNew *local_30;
  StructNew *ret;
  Builder *this_local;
  initializer_list<wasm::Expression_*> args_local;
  HeapType type_local;
  
  args_local._M_array = (iterator)args._M_len;
  this_local = (Builder *)args._M_array;
  ret = (StructNew *)this;
  args_local._M_len = type.id;
  local_30 = MixedArena::alloc<wasm::StructNew>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::initializer_list<wasm::Expression*>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
             &local_30->operands,(initializer_list<wasm::Expression_*> *)&this_local);
  wasm::Type::Type(&local_38,(HeapType)args_local._M_len,NonNullable,Inexact);
  (local_30->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id =
       local_38.id;
  StructNew::finalize(local_30);
  return local_30;
}

Assistant:

StructNew* makeStructNew(HeapType type,
                           std::initializer_list<Expression*> args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands.set(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }